

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_mul_comb_after_precomp
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *T,
              uchar T_size,uchar w,size_t d,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              mbedtls_ecp_restart_ctx *rs_ctx)

{
  int iVar1;
  mbedtls_ecp_point *RR;
  uchar k [262];
  uchar parity_trick;
  int ret;
  uchar w_local;
  uchar T_size_local;
  mbedtls_ecp_point *T_local;
  mbedtls_mpi *m_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  k[0x100] = 0x92;
  k[0x101] = 0xff;
  k[0x102] = 0xff;
  k[0x103] = 0xff;
  k._256_4_ = ecp_comb_recode_scalar(grp,m,(uchar *)&RR,d,w,k + 0xff);
  if ((((k._256_4_ == 0) &&
       (k._256_4_ = ecp_mul_comb_core(grp,R,T,T_size,(uchar *)&RR,d,f_rng,p_rng,rs_ctx),
       k._256_4_ == 0)) && (k._256_4_ = ecp_safe_invert_jac(grp,R,k[0xff]), k._256_4_ == 0)) &&
     ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
      (k._256_4_ = ecp_randomize_jac(grp,R,f_rng,p_rng), k._256_4_ == 0)))) {
    k[0x100] = '\0';
    k[0x101] = '\0';
    k[0x102] = '\0';
    k[0x103] = '\0';
    k._256_4_ = ecp_normalize_jac(grp,R);
  }
  iVar1._0_1_ = k[0x100];
  iVar1._1_1_ = k[0x101];
  iVar1._2_1_ = k[0x102];
  iVar1._3_1_ = k[0x103];
  return iVar1;
}

Assistant:

static int ecp_mul_comb_after_precomp( const mbedtls_ecp_group *grp,
                                mbedtls_ecp_point *R,
                                const mbedtls_mpi *m,
                                const mbedtls_ecp_point *T,
                                unsigned char T_size,
                                unsigned char w,
                                size_t d,
                                int (*f_rng)(void *, unsigned char *, size_t),
                                void *p_rng,
                                mbedtls_ecp_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char parity_trick;
    unsigned char k[COMB_MAX_D + 1];
    mbedtls_ecp_point *RR = R;

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL && rs_ctx->rsm != NULL )
    {
        RR = &rs_ctx->rsm->R;

        if( rs_ctx->rsm->state == ecp_rsm_final_norm )
            goto final_norm;
    }
#endif

    MBEDTLS_MPI_CHK( ecp_comb_recode_scalar( grp, m, k, d, w,
                                            &parity_trick ) );
    MBEDTLS_MPI_CHK( ecp_mul_comb_core( grp, RR, T, T_size, k, d,
                                        f_rng, p_rng, rs_ctx ) );
    MBEDTLS_MPI_CHK( ecp_safe_invert_jac( grp, RR, parity_trick ) );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL && rs_ctx->rsm != NULL )
        rs_ctx->rsm->state = ecp_rsm_final_norm;

final_norm:
#endif
    /*
     * Knowledge of the jacobian coordinates may leak the last few bits of the
     * scalar [1], and since our MPI implementation isn't constant-flow,
     * inversion (used for coordinate normalization) may leak the full value
     * of its input via side-channels [2].
     *
     * [1] https://eprint.iacr.org/2003/191
     * [2] https://eprint.iacr.org/2020/055
     *
     * Avoid the leak by randomizing coordinates before we normalize them.
     */
    if( f_rng != 0 )
        MBEDTLS_MPI_CHK( ecp_randomize_jac( grp, RR, f_rng, p_rng ) );

    MBEDTLS_ECP_BUDGET( MBEDTLS_ECP_OPS_INV );
    MBEDTLS_MPI_CHK( ecp_normalize_jac( grp, RR ) );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL && rs_ctx->rsm != NULL )
        MBEDTLS_MPI_CHK( mbedtls_ecp_copy( R, RR ) );
#endif

cleanup:
    return( ret );
}